

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O2

TestStatus *
vkt::pipeline::anon_unknown_0::SampledImage::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  VkSampleCountFlagBits VVar1;
  Location LVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  undefined8 uVar4;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  Context *context_00;
  Handle<(vk::HandleType)17> renderPass;
  Handle<(vk::HandleType)14> fragmentModule;
  Handle<(vk::HandleType)14> vertexModule;
  deUint32 queueFamilyIndex;
  int iVar5;
  VkResult result;
  int iVar6;
  DeviceInterface *vk;
  InstanceInterface *vki;
  VkDevice device;
  VkPhysicalDevice physDevice;
  TestLog *this;
  TextureFormat format;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  ProgramBinary *pPVar7;
  void *__buf;
  int iVar8;
  size_t sVar9;
  int y;
  undefined4 uVar10;
  allocator<char> local_6b1;
  VkPipelineLayout local_6b0;
  RefBase<vk::VkCommandBuffer_s_*> local_6a8;
  TestStatus *local_688;
  VkDeviceSize local_680;
  Context *local_678;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> checksumBufferAlloc;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferAlloc;
  string local_638;
  string local_618;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_5f8;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_5d8;
  VkSubpassDescription *local_5b8;
  VkQueue local_5b0;
  VkAttachmentReference colorAttachmentRef;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_588;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_568;
  LogSection local_548;
  VkDeviceSize vertexBufferOffset;
  pointer pWStack_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  pointer local_4e8;
  VkSamplerAddressMode VStack_4e0;
  float fStack_4dc;
  VkBool32 VStack_4d8;
  float fStack_4d4;
  pointer pVStack_4d0;
  pointer local_4c8;
  undefined8 uStack_4c0;
  VkImageSubresourceRange res_1;
  VkImageSubresourceRange res;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_348;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_328;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_308;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_2e8;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> checksumImageAlloc;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorImageAlloc;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  VkDescriptorImageInfo imageDescriptorInfo;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_278;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_258;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_238;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_218;
  RefBase<vk::Handle<(vk::HandleType)20>_> local_1f8;
  undefined1 local_1d0 [8];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  pointer pVStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 local_198;
  VkSubpassDescription *local_190;
  deUint32 local_188;
  VkSubpassDependency *local_180;
  
  local_688 = __return_storage_ptr__;
  vk = Context::getDeviceInterface(context);
  vki = Context::getInstanceInterface(context);
  device = Context::getDevice(context);
  physDevice = Context::getPhysicalDevice(context);
  local_5b0 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_6b0.m_internal = (deUint64)Context::getDefaultAllocator(context);
  sVar9 = (size_t)caseDef->colorFormat;
  checkImageFormatRequirements(vki,physDevice,caseDef->numSamples,caseDef->colorFormat,0x14);
  LVar2 = (Location)context->m_testCtx->m_log;
  local_678 = context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"Description",(allocator<char> *)&local_6a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"",(allocator<char> *)&local_2e8);
  tcu::LogSection::LogSection(&local_548,&local_618,&local_638);
  tcu::LogSection::write(&local_548,LVar2.m_binding,__buf,sVar9);
  local_1b8 = (undefined1  [8])LVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_1b0);
  std::operator<<((ostream *)&pVStack_1b0,
                  "Rendering to a multisampled image. Expecting all samples to be either a clear color or a primitive color."
                 );
  vertexBufferOffset =
       (VkDeviceSize)
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pWStack_500);
  std::operator<<((ostream *)&pWStack_500,
                  "Sampling from the texture with texelFetch (OpImageFetch).");
  this = tcu::MessageBuilder::operator<<
                   ((MessageBuilder *)&vertexBufferOffset,
                    (EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::endSection(this);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pWStack_500);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_1b0);
  tcu::LogSection::~LogSection(&local_548);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_618);
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&vertexBufferOffset,vk,device,
            caseDef->colorFormat,&caseDef->renderSize,caseDef->numLayers,caseDef->numSamples,0x14);
  local_618.field_2._M_allocated_capacity = local_4f8._M_allocated_capacity;
  local_618.field_2._8_8_ = local_4f8._8_8_;
  local_618._M_dataplus._M_p = (pointer)vertexBufferOffset;
  local_618._M_string_length = (size_type)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&vertexBufferOffset);
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&vertexBufferOffset,vk,
            device,(Allocator *)local_6b0.m_internal,(VkImage)local_618._M_dataplus._M_p,
            (MemoryRequirement)0x0);
  colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)vertexBufferOffset;
  vertexBufferOffset = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&vertexBufferOffset)
  ;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&vertexBufferOffset,vk,device,2,
             queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  local_638.field_2._M_allocated_capacity = local_4f8._M_allocated_capacity;
  local_638.field_2._8_8_ = local_4f8._8_8_;
  local_638._M_dataplus._M_p = (pointer)vertexBufferOffset;
  local_638._M_string_length = (size_type)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&vertexBufferOffset);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&vertexBufferOffset,vk,device,
                    (VkCommandPool)local_638._M_dataplus._M_p);
  context_00 = local_678;
  local_6a8.m_data.deleter.m_device = (VkDevice)local_4f8._M_allocated_capacity;
  local_6a8.m_data.deleter.m_pool.m_internal = local_4f8._8_8_;
  local_6a8.m_data.object = (VkCommandBuffer_s *)vertexBufferOffset;
  local_6a8.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&vertexBufferOffset);
  local_5b8 = *(VkSubpassDescription **)(caseDef->renderSize).m_data;
  renderMultisampledImage(context_00,caseDef,(VkImage)local_618._M_dataplus._M_p);
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = caseDef->numLayers;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&vertexBufferOffset,vk,device,
                (VkImage)local_618._M_dataplus._M_p,
                (uint)(caseDef->numLayers != 1) * 4 + VK_IMAGE_VIEW_TYPE_2D,caseDef->colorFormat,
                subresourceRange);
  local_2e8.m_data.deleter.m_device = (VkDevice)local_4f8._M_allocated_capacity;
  local_2e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4f8._8_8_;
  local_2e8.m_data.object.m_internal = vertexBufferOffset;
  local_2e8.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&vertexBufferOffset);
  pWStack_500 = (pointer)0x0;
  fStack_4dc = 0.0;
  VStack_4d8 = 0;
  local_4c8 = (pointer)0x0;
  uStack_4c0 = 0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  vertexBufferOffset = 0x1f;
  local_4e8 = (pointer)&DAT_200000002;
  VStack_4e0 = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  fStack_4d4 = 1.0;
  pVStack_4d0 = (pointer)0x700000000;
  ::vk::createSampler((Move<vk::Handle<(vk::HandleType)20>_> *)local_1b8,vk,device,
                      (VkSamplerCreateInfo *)&vertexBufferOffset,(VkAllocationCallbacks *)0x0);
  local_1f8.m_data.object.m_internal = (deUint64)local_1b8;
  local_1f8.m_data.deleter.m_deviceIface = (DeviceInterface *)pVStack_1b0;
  local_1f8.m_data.deleter.m_device = (VkDevice)local_1a8._M_allocated_capacity;
  local_1f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1a8._8_8_;
  local_1b8._0_4_ = 0;
  local_1b8._4_4_ = 0;
  pVStack_1b0 = (pointer)0x0;
  local_1a8._M_allocated_capacity = 0;
  local_1a8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)20>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)20>_> *)local_1b8);
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&vertexBufferOffset,vk,device,VK_FORMAT_R32_SINT
            ,&caseDef->renderSize,1,VK_SAMPLE_COUNT_1_BIT,0x11);
  local_5d8.m_data.deleter.m_device = (VkDevice)local_4f8._M_allocated_capacity;
  local_5d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4f8._8_8_;
  local_5d8.m_data.object.m_internal = vertexBufferOffset;
  local_5d8.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&vertexBufferOffset);
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&vertexBufferOffset,vk,
            device,(Allocator *)local_6b0.m_internal,(VkImage)local_5d8.m_data.object.m_internal,
            (MemoryRequirement)0x0);
  checksumImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)vertexBufferOffset;
  vertexBufferOffset = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&vertexBufferOffset)
  ;
  res_1.aspectMask = 1;
  res_1.baseMipLevel = 0;
  res_1.levelCount = 1;
  res_1.baseArrayLayer = 0;
  res_1.layerCount = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&vertexBufferOffset,vk,device,
                (VkImage)local_5d8.m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R32_SINT
                ,subresourceRange_00);
  local_218.m_data.deleter.m_device = (VkDevice)local_4f8._M_allocated_capacity;
  local_218.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4f8._8_8_;
  local_218.m_data.object.m_internal = vertexBufferOffset;
  local_218.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&vertexBufferOffset);
  iVar6 = (caseDef->renderSize).m_data[1];
  iVar8 = (caseDef->renderSize).m_data[0];
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SINT);
  iVar5 = tcu::getPixelSize(format);
  local_680 = (VkDeviceSize)(iVar6 * iVar8 * iVar5);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset,vk,device,local_680,2);
  local_568.m_data.deleter.m_device = (VkDevice)local_4f8._M_allocated_capacity;
  local_568.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4f8._8_8_;
  local_568.m_data.object.m_internal = vertexBufferOffset;
  local_568.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&vertexBufferOffset,vk,
             device,(Allocator *)local_6b0.m_internal,(VkBuffer)local_568.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  checksumBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)vertexBufferOffset;
  vertexBufferOffset = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&vertexBufferOffset)
  ;
  zeroBuffer(vk,device,
             checksumBufferAlloc.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr,
             local_680);
  if (pipeline::(anonymous_namespace)::genFullQuadVertices()::data == '\0') {
    iVar6 = __cxa_guard_acquire(&pipeline::(anonymous_namespace)::genFullQuadVertices()::data);
    if (iVar6 != 0) {
      pipeline::(anonymous_namespace)::genFullQuadVertices()::data._0_8_ = 0xbf800000bf800000;
      pipeline::(anonymous_namespace)::genFullQuadVertices()::data._8_8_ = 0x3f80000000000000;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)
                 (pipeline::(anonymous_namespace)::genFullQuadVertices()::data + 0x10));
      pipeline::(anonymous_namespace)::genFullQuadVertices()::data._32_8_ = 0x3f800000bf800000;
      pipeline::(anonymous_namespace)::genFullQuadVertices()::data._40_8_ = 0x3f80000000000000;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)
                 (pipeline::(anonymous_namespace)::genFullQuadVertices()::data + 0x30));
      pipeline::(anonymous_namespace)::genFullQuadVertices()::data._64_8_ = 0xbf8000003f800000;
      pipeline::(anonymous_namespace)::genFullQuadVertices()::data._72_8_ = 0x3f80000000000000;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)
                 (pipeline::(anonymous_namespace)::genFullQuadVertices()::data + 0x50));
      pipeline::(anonymous_namespace)::genFullQuadVertices()::data._96_8_ = &DAT_3f8000003f800000;
      pipeline::(anonymous_namespace)::genFullQuadVertices()::data._104_8_ = 0x3f80000000000000;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)
                 (pipeline::(anonymous_namespace)::genFullQuadVertices()::data + 0x70));
      __cxa_guard_release(&pipeline::(anonymous_namespace)::genFullQuadVertices()::data);
    }
  }
  std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
  vector<vkt::pipeline::Vertex4RGBA_const*,void>
            ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
             &vertices,(Vertex4RGBA *)pipeline::(anonymous_namespace)::genFullQuadVertices()::data,
             (Vertex4RGBA *)&pipeline::(anonymous_namespace)::genFullQuadVertices()::data,
             (allocator_type *)&vertexBufferOffset);
  sVar9 = (long)vertices.
                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vertices.
                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ._M_impl.super__Vector_impl_data._M_start;
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset,vk,device,sVar9,0x80);
  local_308.m_data.deleter.m_device = (VkDevice)local_4f8._M_allocated_capacity;
  local_308.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4f8._8_8_;
  local_308.m_data.object.m_internal = vertexBufferOffset;
  local_308.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&vertexBufferOffset,vk,
             device,(Allocator *)local_6b0.m_internal,(VkBuffer)local_308.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  vertexBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
       = (Allocation *)vertexBufferOffset;
  vertexBufferOffset = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&vertexBufferOffset)
  ;
  memcpy((vertexBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
          m_data.ptr)->m_hostPtr,
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_start,sVar9);
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((vertexBufferAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,sVar9);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&vertexBufferOffset);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleSamplerBinding
                      ((DescriptorSetLayoutBuilder *)&vertexBufferOffset,
                       VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,0x10,(VkSampler *)&local_1f8);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_1b8,this_00,vk,device,0);
  local_328.m_data.deleter.m_device = (VkDevice)local_1a8._M_allocated_capacity;
  local_328.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1a8._8_8_;
  local_328.m_data.object.m_internal = (deUint64)local_1b8;
  local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)pVStack_1b0;
  local_1b8._0_4_ = 0;
  local_1b8._4_4_ = 0;
  pVStack_1b0 = (pointer)0x0;
  local_1a8._M_allocated_capacity = 0;
  local_1a8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_1b8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&vertexBufferOffset);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_1b8);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)local_1b8,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,
                       1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&vertexBufferOffset,this_01,vk,device,1,1);
  local_238.m_data.deleter.m_device = (VkDevice)local_4f8._M_allocated_capacity;
  local_238.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4f8._8_8_;
  local_238.m_data.object.m_internal = vertexBufferOffset;
  local_238.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&vertexBufferOffset);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )local_1b8);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&vertexBufferOffset,vk,device,
                    (VkDescriptorPool)local_238.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_328.m_data.object.m_internal);
  local_348.m_data.deleter.m_device = (VkDevice)local_4f8._M_allocated_capacity;
  local_348.m_data.deleter.m_pool.m_internal = local_4f8._8_8_;
  local_348.m_data.object.m_internal = vertexBufferOffset;
  local_348.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&vertexBufferOffset);
  imageDescriptorInfo.sampler.m_internal = 0;
  imageDescriptorInfo.imageView.m_internal = local_2e8.m_data.object.m_internal;
  imageDescriptorInfo.imageLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&vertexBufferOffset);
  local_1b8._0_4_ = 0;
  local_1b8._4_4_ = 0;
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&vertexBufferOffset,
                       (VkDescriptorSet)local_348.m_data.object.m_internal,(Location *)local_1b8,
                       VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,&imageDescriptorInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&vertexBufferOffset);
  pPVar3 = local_678->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"sample_vert",(allocator<char> *)&local_548);
  pPVar7 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)local_1b8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&vertexBufferOffset,vk,device,pPVar7,0);
  local_258.m_data.deleter.m_device = (VkDevice)local_4f8._M_allocated_capacity;
  local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4f8._8_8_;
  local_258.m_data.object.m_internal = vertexBufferOffset;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&vertexBufferOffset);
  std::__cxx11::string::~string((string *)local_1b8);
  pPVar3 = local_678->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"sample_frag",(allocator<char> *)&local_548);
  pPVar7 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)local_1b8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&vertexBufferOffset,vk,device,pPVar7,0);
  local_278.m_data.deleter.m_device = (VkDevice)local_4f8._M_allocated_capacity;
  local_278.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4f8._8_8_;
  local_278.m_data.object.m_internal = vertexBufferOffset;
  local_278.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&vertexBufferOffset);
  std::__cxx11::string::~string((string *)local_1b8);
  local_548.m_name._M_dataplus._M_p = (pointer)0x6300000000;
  local_548.m_name._M_string_length = 0x100000001;
  local_548.m_name.field_2._M_allocated_capacity = 0x200000000;
  local_548.m_name.field_2._8_8_ = 1;
  local_548.m_description._M_dataplus._M_p._0_4_ = 2;
  local_4e8 = (pointer)&colorAttachmentRef;
  colorAttachmentRef.attachment = 0;
  colorAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_4f8._M_allocated_capacity = 0;
  VStack_4e0 = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  fStack_4dc = 0.0;
  VStack_4d8 = 0;
  fStack_4d4 = 0.0;
  pVStack_4d0 = (pointer)0x0;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4c8 = (pointer)0x0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x1;
  local_1b8._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  pVStack_1b0 = (pointer)0x0;
  local_1a8._M_allocated_capacity = (size_type)&DAT_100000000;
  local_198._0_4_ = 1;
  local_188 = 0;
  local_180 = (VkSubpassDependency *)0x0;
  local_1a8._8_8_ = &local_548;
  local_190 = (VkSubpassDescription *)&vertexBufferOffset;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&local_5f8,vk,device,
             (VkRenderPassCreateInfo *)local_1b8,(VkAllocationCallbacks *)0x0);
  local_588.m_data.object.m_internal = local_5f8.m_data.object.m_internal;
  local_588.m_data.deleter.m_deviceIface = local_5f8.m_data.deleter.m_deviceIface;
  local_588.m_data.deleter.m_device = local_5f8.m_data.deleter.m_device;
  local_588.m_data.deleter.m_allocator = local_5f8.m_data.deleter.m_allocator;
  local_5f8.m_data.object.m_internal = 0;
  local_5f8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_5f8.m_data.deleter.m_device = (VkDevice)0x0;
  local_5f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_5f8);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset,vk,device,
                  (VkRenderPass)local_588.m_data.object.m_internal,1,(VkImageView *)&local_218,
                  (caseDef->renderSize).m_data[0],(caseDef->renderSize).m_data[1],1);
  local_548.m_name.field_2._M_allocated_capacity = local_4f8._M_allocated_capacity;
  local_548.m_name.field_2._8_8_ = local_4f8._8_8_;
  local_548.m_name._M_dataplus._M_p = (pointer)vertexBufferOffset;
  local_548.m_name._M_string_length = (size_type)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&vertexBufferOffset,vk,device,
                     (VkDescriptorSetLayout)local_328.m_data.object.m_internal);
  local_5f8.m_data.deleter.m_device = (VkDevice)local_4f8._M_allocated_capacity;
  local_5f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4f8._8_8_;
  local_5f8.m_data.object.m_internal = vertexBufferOffset;
  local_5f8.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_500;
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&vertexBufferOffset);
  vertexModule.m_internal = local_258.m_data.object.m_internal;
  fragmentModule.m_internal = local_278.m_data.object.m_internal;
  renderPass.m_internal = local_588.m_data.object.m_internal;
  local_6b0.m_internal = local_5f8.m_data.object.m_internal;
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)local_1d0,&caseDef->renderSize);
  makeGraphicsPipelines
            (&pipelines,vk,device,1,local_6b0,(VkRenderPass)renderPass.m_internal,
             (VkShaderModule)vertexModule.m_internal,(VkShaderModule)fragmentModule.m_internal,
             (IVec2)local_1d0,VK_SAMPLE_COUNT_1_BIT,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP);
  beginCommandBuffer(vk,local_6a8.m_data.object);
  vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,0x2d);
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0x2000000100;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x500000002;
  local_4e8 = (pointer)0xffffffffffffffff;
  VStack_4e0 = (VkSamplerAddressMode)local_618._M_dataplus._M_p;
  fStack_4dc = (float)((ulong)local_618._M_dataplus._M_p >> 0x20);
  VStack_4d8 = 1;
  fStack_4d4 = 0.0;
  pVStack_4d0 = (pointer)0x1;
  local_4c8._0_4_ = (float)caseDef->numLayers;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_6a8.m_data.object,0x400,0x80,0,0,0,0,0,1,&vertexBufferOffset);
  local_180 = (VkSubpassDependency *)local_1c8;
  local_1c8._0_4_ = 0;
  local_1c8._4_4_ = 0;
  local_1c8._8_4_ = 0;
  local_1c8._12_4_ = 0;
  local_1b8._0_4_ = 0x2b;
  pVStack_1b0 = (pointer)0x0;
  local_1a8._M_allocated_capacity = local_588.m_data.object.m_internal;
  local_1a8._8_8_ = local_548.m_name._M_dataplus._M_p;
  local_198 = 0;
  local_190 = local_5b8;
  local_188 = 1;
  (*vk->_vptr_DeviceInterface[0x74])(vk,local_6a8.m_data.object,local_1b8,0);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_6a8.m_data.object,0,
             ((pipelines.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
             super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,local_6a8.m_data.object,0,local_5f8.m_data.object.m_internal,0,1,(int)&local_348,0,0
            );
  vertexBufferOffset = 0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_6a8.m_data.object,0,1);
  (*vk->_vptr_DeviceInterface[0x59])
            (vk,local_6a8.m_data.object,
             (ulong)((long)vertices.
                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5,1);
  (*vk->_vptr_DeviceInterface[0x76])(vk,local_6a8.m_data.object);
  vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,0x2d);
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0x80000000100;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0x600000002;
  local_4e8 = (pointer)0xffffffffffffffff;
  VStack_4e0 = (VkSamplerAddressMode)local_5d8.m_data.object.m_internal;
  fStack_4dc = (float)(local_5d8.m_data.object.m_internal >> 0x20);
  VStack_4d8 = 1;
  fStack_4d4 = 0.0;
  pVStack_4d0 = (pointer)0x1;
  local_4c8 = (pointer)CONCAT44(local_4c8._4_4_,1);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_6a8.m_data.object,0x400,0x1000,0,0,0,0,0,1,&vertexBufferOffset);
  vertexBufferOffset = 0;
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 1;
  local_4f8._8_8_ = &DAT_100000000;
  local_4e8 = (pointer)0x0;
  VStack_4e0 = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  uVar4 = *(undefined8 *)(caseDef->renderSize).m_data;
  fStack_4dc = (float)uVar4;
  VStack_4d8 = (VkBool32)((ulong)uVar4 >> 0x20);
  fStack_4d4 = 1.4013e-45;
  uVar10 = SUB84(&vertexBufferOffset,0);
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_6a8.m_data.object,local_5d8.m_data.object.m_internal,6,
             local_568.m_data.object.m_internal,1,uVar10);
  vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,0x2c);
  pWStack_500 = (pointer)0x0;
  local_4f8._M_allocated_capacity = 0x200000001000;
  local_4f8._8_8_ = (VkAllocationCallbacks *)0xffffffffffffffff;
  local_4e8 = (pointer)local_568.m_data.object.m_internal;
  VStack_4e0 = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  fStack_4dc = 0.0;
  VStack_4d8 = (VkBool32)local_680;
  fStack_4d4 = (float)(local_680 >> 0x20);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,local_6a8.m_data.object,0x1000,0x4000,0,0,0,1,uVar10,0,0);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_6a8.m_data.object);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
                    ,0x465);
  submitCommandsAndWait(vk,device,local_5b0,local_6a8.m_data.object);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((checksumBufferAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,0,local_680);
  colorAttachmentRef = (VkAttachmentReference)::vk::mapVkFormat(VK_FORMAT_R32_SINT);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&vertexBufferOffset,(TextureFormat *)&colorAttachmentRef,
             (caseDef->renderSize).m_data[0],(caseDef->renderSize).m_data[1],1,
             (checksumBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  iVar6 = caseDef->numLayers;
  VVar1 = caseDef->numSamples;
  iVar8 = 0;
  do {
    iVar5 = (caseDef->renderSize).m_data[1];
    if (iVar5 <= iVar8) {
LAB_0051c8a2:
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ::~vector(&pipelines);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_5f8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&local_548);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_588);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_278);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_258);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_348);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_238);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_328);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                (&vertexBufferAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_308);
      std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
      ~_Vector_base(&vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   );
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                (&checksumBufferAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_568);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_218);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                (&checksumImageAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_5d8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)20>_>::~RefBase(&local_1f8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_2e8);
      if (iVar5 <= iVar8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vertexBufferOffset,"OK",(allocator<char> *)local_1b8);
        tcu::TestStatus::pass(local_688,(string *)&vertexBufferOffset);
        std::__cxx11::string::~string((string *)&vertexBufferOffset);
      }
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_6a8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_638);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                (&colorImageAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&local_618);
      return local_688;
    }
    y = 0;
    while (y < (caseDef->renderSize).m_data[0]) {
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)&colorAttachmentRef,(int)&vertexBufferOffset,y,iVar8);
      y = y + 1;
      if (colorAttachmentRef.attachment != iVar6 * VVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&colorAttachmentRef,"Some samples have incorrect color",&local_6b1);
        tcu::TestStatus::fail(local_688,(string *)&colorAttachmentRef);
        std::__cxx11::string::~string((string *)&colorAttachmentRef);
        goto LAB_0051c8a2;
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const InstanceInterface&	vki					= context.getInstanceInterface();
	const VkDevice				device				= context.getDevice();
	const VkPhysicalDevice		physDevice			= context.getPhysicalDevice();
	const VkQueue				queue				= context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&					allocator			= context.getDefaultAllocator();

	const VkImageUsageFlags		colorImageUsage		= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_SAMPLED_BIT;

	checkImageFormatRequirements(vki, physDevice, caseDef.numSamples, caseDef.colorFormat, colorImageUsage);

	{
		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::LogSection("Description", "")
			<< tcu::TestLog::Message << "Rendering to a multisampled image. Expecting all samples to be either a clear color or a primitive color." << tcu::TestLog::EndMessage
			<< tcu::TestLog::Message << "Sampling from the texture with texelFetch (OpImageFetch)." << tcu::TestLog::EndMessage
			<< tcu::TestLog::EndSection;
	}

	// Multisampled color image
	const Unique<VkImage>			colorImage		(makeImage(vk, device, caseDef.colorFormat, caseDef.renderSize, caseDef.numLayers, caseDef.numSamples, colorImageUsage));
	const UniquePtr<Allocation>		colorImageAlloc	(bindImage(vk, device, allocator, *colorImage, MemoryRequirement::Any));

	const Unique<VkCommandPool>		cmdPool			(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		(makeCommandBuffer(vk, device, *cmdPool));

	const VkRect2D renderArea = {
		makeOffset2D(0, 0),
		makeExtent2D(caseDef.renderSize.x(), caseDef.renderSize.y()),
	};

	// Step 1: Render to texture
	{
		renderMultisampledImage(context, caseDef, *colorImage);
	}

	// Step 2: Sample texture
	{
		// Color image view
		const VkImageViewType			colorImageViewType	= (caseDef.numLayers == 1 ? VK_IMAGE_VIEW_TYPE_2D : VK_IMAGE_VIEW_TYPE_2D_ARRAY);
		const Unique<VkImageView>		colorImageView		(makeImageView(vk, device, *colorImage, colorImageViewType, caseDef.colorFormat, makeColorSubresourceRange(0, caseDef.numLayers)));
		const Unique<VkSampler>			colorSampler		(makeSampler(vk, device));

		// Checksum image
		const VkFormat					checksumFormat		= VK_FORMAT_R32_SINT;
		const Unique<VkImage>			checksumImage		(makeImage(vk, device, checksumFormat, caseDef.renderSize, 1u, VK_SAMPLE_COUNT_1_BIT,
																	   VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT));
		const UniquePtr<Allocation>		checksumImageAlloc	(bindImage(vk, device, allocator, *checksumImage, MemoryRequirement::Any));
		const Unique<VkImageView>		checksumImageView	(makeImageView(vk, device, *checksumImage, VK_IMAGE_VIEW_TYPE_2D, checksumFormat, makeColorSubresourceRange(0, 1)));

		// Checksum buffer (for host reading)
		const VkDeviceSize				checksumBufferSize	= caseDef.renderSize.x() * caseDef.renderSize.y() * tcu::getPixelSize(mapVkFormat(checksumFormat));
		const Unique<VkBuffer>			checksumBuffer		(makeBuffer(vk, device, checksumBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
		const UniquePtr<Allocation>		checksumBufferAlloc	(bindBuffer(vk, device, allocator, *checksumBuffer, MemoryRequirement::HostVisible));

		zeroBuffer(vk, device, *checksumBufferAlloc, checksumBufferSize);

		// Vertex buffer
		const std::vector<Vertex4RGBA>	vertices			= genFullQuadVertices();
		const VkDeviceSize				vertexBufferSize	= sizeInBytes(vertices);
		const Unique<VkBuffer>			vertexBuffer		(makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
		const UniquePtr<Allocation>		vertexBufferAlloc	(bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible));

		{
			deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
			flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		// Descriptors
		// \note OpImageFetch doesn't use a sampler, but in GLSL texelFetch needs a sampler2D which translates to a combined image sampler in Vulkan.

		const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
			.addSingleSamplerBinding(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, VK_SHADER_STAGE_FRAGMENT_BIT, &colorSampler.get())
			.build(vk, device));

		const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
			.addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

		const Unique<VkDescriptorSet>	descriptorSet		(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
		const VkDescriptorImageInfo		imageDescriptorInfo	= makeDescriptorImageInfo(DE_NULL, *colorImageView, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL);

		DescriptorSetUpdateBuilder()
			.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &imageDescriptorInfo)
			.update(vk, device);

		const Unique<VkShaderModule>	vertexModule	(createShaderModule		(vk, device, context.getBinaryCollection().get("sample_vert"), 0u));
		const Unique<VkShaderModule>	fragmentModule	(createShaderModule		(vk, device, context.getBinaryCollection().get("sample_frag"), 0u));
		const Unique<VkRenderPass>		renderPass		(makeSimpleRenderPass	(vk, device, checksumFormat));
		const Unique<VkFramebuffer>		framebuffer		(makeFramebuffer		(vk, device, *renderPass, 1u, &checksumImageView.get(),
																				 static_cast<deUint32>(caseDef.renderSize.x()),  static_cast<deUint32>(caseDef.renderSize.y())));
		const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout		(vk, device, *descriptorSetLayout));
		const std::vector<PipelineSp>	pipelines		(makeGraphicsPipelines	(vk, device, 1u, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
																				 caseDef.renderSize, VK_SAMPLE_COUNT_1_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP));

		beginCommandBuffer(vk, *cmdBuffer);

		// Prepare for sampling in the fragment shader
		{
			const VkImageMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,						// VkStructureType			sType;
					DE_NULL,													// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,						// VkAccessFlags			outputMask;
					VK_ACCESS_SHADER_READ_BIT,									// VkAccessFlags			inputMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,					// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					destQueueFamilyIndex;
					*colorImage,												// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers),			// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}

		const VkClearValue clearValue = makeClearValueColorU32(0u, 0u, 0u, 0u);

		const VkRenderPassBeginInfo renderPassBeginInfo = {
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,							// VkStructureType         sType;
			DE_NULL,															// const void*             pNext;
			*renderPass,														// VkRenderPass            renderPass;
			*framebuffer,														// VkFramebuffer           framebuffer;
			renderArea,															// VkRect2D                renderArea;
			1u,																	// uint32_t                clearValueCount;
			&clearValue,														// const VkClearValue*     pClearValues;
		};
		vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipelines.back());
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(vertices.size()), 1u, 0u, 0u);
		vk.cmdEndRenderPass(*cmdBuffer);

		// Prepare checksum image for copy
		{
			const VkImageMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,						// VkStructureType			sType;
					DE_NULL,													// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,						// VkAccessFlags			outputMask;
					VK_ACCESS_TRANSFER_READ_BIT,								// VkAccessFlags			inputMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					destQueueFamilyIndex;
					*checksumImage,												// VkImage					image;
					makeColorSubresourceRange(0, 1),							// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}
		// Checksum image -> host buffer
		{
			const VkBufferImageCopy region =
			{
				0ull,																		// VkDeviceSize                bufferOffset;
				0u,																			// uint32_t                    bufferRowLength;
				0u,																			// uint32_t                    bufferImageHeight;
				makeColorSubresourceLayers(0, 1),											// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),														// VkOffset3D                  imageOffset;
				makeExtent3D(caseDef.renderSize.x(), caseDef.renderSize.y(), 1u),			// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*cmdBuffer, *checksumImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *checksumBuffer, 1u, &region);
		}
		// Buffer write barrier
		{
			const VkBufferMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType    sType;
					DE_NULL,										// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,						// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           dstQueueFamilyIndex;
					*checksumBuffer,								// VkBuffer           buffer;
					0ull,											// VkDeviceSize       offset;
					checksumBufferSize,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, DE_NULL, 0u);
		}

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify result

		{
			invalidateMappedMemoryRange(vk, device, checksumBufferAlloc->getMemory(), 0ull, checksumBufferSize);

			const tcu::ConstPixelBufferAccess access(mapVkFormat(checksumFormat), caseDef.renderSize.x(), caseDef.renderSize.y(), 1, checksumBufferAlloc->getHostPtr());
			const int numExpectedChecksum = getNumSamples(caseDef.numSamples) * caseDef.numLayers;

			for (int y = 0; y < caseDef.renderSize.y(); ++y)
			for (int x = 0; x < caseDef.renderSize.x(); ++x)
			{
				if (access.getPixelInt(x, y).x() != numExpectedChecksum)
					return tcu::TestStatus::fail("Some samples have incorrect color");
			}
		}
	}

	return tcu::TestStatus::pass("OK");
}